

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pffft.c
# Opt level: O1

v4sf * rfftf1_ps(int n,v4sf *input_readonly,v4sf *work1,v4sf *work2,float *wa,int *ifac)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  v4sf *pafVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  v4sf *pafVar13;
  long lVar14;
  v4sf *pafVar15;
  uint l1;
  v4sf *pafVar16;
  v4sf *pafVar17;
  v4sf *pafVar18;
  int iVar19;
  v4sf *pafVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  v4sf *pafVar25;
  int iVar26;
  long lVar27;
  int iVar28;
  int iVar29;
  v4sf *pafVar30;
  v4sf *pafVar31;
  long lVar32;
  bool bVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  ulong local_108;
  v4sf *local_e8;
  v4sf *local_e0;
  v4sf *local_c8;
  
  uVar12 = (ulong)(uint)n;
  local_c8 = work2;
  if (input_readonly == work2) {
    local_c8 = work1;
  }
  if ((work1 != work2) && (local_c8 != input_readonly)) {
    uVar4 = ifac[1];
    if (0 < (int)uVar4) {
      uVar23 = 1;
      iVar5 = n + -1;
      do {
        iVar26 = ifac[(uVar4 - uVar23) + 2];
        iVar11 = (int)uVar12;
        uVar21 = (long)iVar11 / (long)iVar26;
        uVar12 = uVar21 & 0xffffffff;
        iVar11 = n / iVar11;
        if (3 < iVar26 - 2U) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jcj83429[P]ShapingClipper/pffft.c"
                        ,0x3e2,
                        "v4sf *rfftf1_ps(int, const v4sf *, v4sf *, v4sf *, const float *, const int *)"
                       );
        }
        iVar28 = (iVar26 + -1) * iVar11;
        iVar19 = iVar5 - iVar28;
        l1 = (uint)uVar21;
        switch(iVar26) {
        case 2:
          radf2_ps(iVar11,l1,input_readonly,local_c8,wa + iVar19);
          break;
        case 3:
          if (0 < (int)l1) {
            lVar7 = (long)iVar11;
            uVar21 = uVar12;
            pafVar9 = input_readonly;
            pafVar17 = local_c8;
            do {
              pfVar2 = (float *)((long)*pafVar9 + lVar7 * 0x10 * uVar12);
              fVar61 = *pfVar2;
              fVar64 = pfVar2[1];
              fVar67 = pfVar2[2];
              fVar63 = pfVar2[3];
              pfVar2 = (float *)((long)*pafVar9 + (ulong)(l1 * 2) * lVar7 * 0x10);
              fVar34 = *pfVar2;
              fVar35 = pfVar2[1];
              fVar36 = pfVar2[2];
              fVar37 = pfVar2[3];
              fVar42 = fVar61 + fVar34;
              fVar43 = fVar64 + fVar35;
              fVar44 = fVar67 + fVar36;
              fVar45 = fVar63 + fVar37;
              fVar38 = (*pafVar9)[0];
              fVar39 = (*pafVar9)[1];
              fVar40 = (*pafVar9)[2];
              fVar41 = (*pafVar9)[3];
              (*pafVar17)[0] = fVar38 + fVar42;
              (*pafVar17)[1] = fVar39 + fVar43;
              (*pafVar17)[2] = fVar40 + fVar44;
              (*pafVar17)[3] = fVar41 + fVar45;
              pafVar20 = pafVar17 + lVar7 * 2;
              (*pafVar20)[0] = (fVar34 - fVar61) * 0.8660254;
              (*pafVar20)[1] = (fVar35 - fVar64) * 0.8660254;
              (*pafVar20)[2] = (fVar36 - fVar67) * 0.8660254;
              (*pafVar20)[3] = (fVar37 - fVar63) * 0.8660254;
              pafVar20 = pafVar17 + lVar7 * 2 + -1;
              (*pafVar20)[0] = fVar42 * -0.5 + fVar38;
              (*pafVar20)[1] = fVar43 * -0.5 + fVar39;
              (*pafVar20)[2] = fVar44 * -0.5 + fVar40;
              (*pafVar20)[3] = fVar45 * -0.5 + fVar41;
              pafVar17 = pafVar17 + lVar7 * 3;
              pafVar9 = pafVar9 + lVar7;
              uVar21 = uVar21 - 1;
            } while (uVar21 != 0);
          }
          if (iVar11 != 1 && 0 < (int)l1) {
            lVar7 = (long)iVar11;
            local_108 = 0;
            do {
              if (2 < iVar11) {
                lVar27 = (local_108 + uVar12) * lVar7;
                lVar10 = (local_108 + l1 * 2) * lVar7;
                lVar14 = local_108 * 3 * lVar7;
                lVar32 = (local_108 * 3 + 2) * lVar7;
                lVar22 = (local_108 * 3 + 1) * lVar7;
                lVar8 = 2;
                do {
                  fVar61 = wa[(long)iVar19 + lVar8 + -2];
                  fVar64 = wa[(long)iVar19 + lVar8 + -1];
                  lVar1 = lVar8 + -1;
                  pafVar9 = input_readonly + lVar1 + lVar27;
                  pafVar17 = input_readonly + lVar1 + lVar10;
                  fVar34 = (*pafVar17)[0];
                  fVar35 = (*pafVar17)[1];
                  fVar36 = (*pafVar17)[2];
                  fVar37 = (*pafVar17)[3];
                  pafVar17 = input_readonly + lVar1 + local_108 * lVar7;
                  fVar38 = (*pafVar17)[0];
                  fVar39 = (*pafVar17)[1];
                  fVar40 = (*pafVar17)[2];
                  fVar41 = (*pafVar17)[3];
                  pafVar17 = input_readonly + lVar8 + lVar27;
                  fVar67 = wa[(long)(iVar19 + iVar11) + lVar8 + -2];
                  fVar63 = wa[(long)(iVar19 + iVar11) + lVar8 + -1];
                  pafVar20 = input_readonly + lVar8 + lVar10;
                  fVar42 = (*pafVar20)[0];
                  fVar43 = (*pafVar20)[1];
                  fVar44 = (*pafVar20)[2];
                  fVar45 = (*pafVar20)[3];
                  fVar50 = fVar64 * (*pafVar17)[0] + (*pafVar9)[0] * fVar61;
                  fVar52 = fVar64 * (*pafVar17)[1] + (*pafVar9)[1] * fVar61;
                  fVar47 = fVar64 * (*pafVar17)[2] + (*pafVar9)[2] * fVar61;
                  fVar49 = fVar64 * (*pafVar17)[3] + (*pafVar9)[3] * fVar61;
                  fVar56 = fVar63 * fVar42 + fVar34 * fVar67;
                  fVar57 = fVar63 * fVar43 + fVar35 * fVar67;
                  fVar58 = fVar63 * fVar44 + fVar36 * fVar67;
                  fVar59 = fVar63 * fVar45 + fVar37 * fVar67;
                  fVar60 = fVar50 + fVar56;
                  fVar62 = fVar52 + fVar57;
                  fVar65 = fVar47 + fVar58;
                  fVar66 = fVar49 + fVar59;
                  fVar51 = fVar61 * (*pafVar17)[0] - (*pafVar9)[0] * fVar64;
                  fVar53 = fVar61 * (*pafVar17)[1] - (*pafVar9)[1] * fVar64;
                  fVar54 = fVar61 * (*pafVar17)[2] - (*pafVar9)[2] * fVar64;
                  fVar55 = fVar61 * (*pafVar17)[3] - (*pafVar9)[3] * fVar64;
                  pafVar9 = local_c8 + lVar1 + lVar14;
                  (*pafVar9)[0] = fVar38 + fVar60;
                  (*pafVar9)[1] = fVar39 + fVar62;
                  (*pafVar9)[2] = fVar40 + fVar65;
                  (*pafVar9)[3] = fVar41 + fVar66;
                  pafVar9 = input_readonly + lVar8 + local_108 * lVar7;
                  fVar61 = (*pafVar9)[0];
                  fVar64 = (*pafVar9)[1];
                  fVar46 = (*pafVar9)[2];
                  fVar48 = (*pafVar9)[3];
                  fVar34 = fVar67 * fVar42 - fVar34 * fVar63;
                  fVar35 = fVar67 * fVar43 - fVar35 * fVar63;
                  fVar44 = fVar67 * fVar44 - fVar36 * fVar63;
                  fVar45 = fVar67 * fVar45 - fVar37 * fVar63;
                  fVar36 = fVar51 + fVar34;
                  fVar37 = fVar53 + fVar35;
                  fVar42 = fVar54 + fVar44;
                  fVar43 = fVar55 + fVar45;
                  fVar38 = fVar38 - fVar60 * 0.5;
                  fVar39 = fVar39 - fVar62 * 0.5;
                  fVar40 = fVar40 - fVar65 * 0.5;
                  fVar41 = fVar41 - fVar66 * 0.5;
                  fVar67 = (fVar51 - fVar34) * 0.8660254;
                  fVar63 = (fVar53 - fVar35) * 0.8660254;
                  fVar34 = (fVar54 - fVar44) * 0.8660254;
                  fVar35 = (fVar55 - fVar45) * 0.8660254;
                  pafVar9 = local_c8 + lVar8 + lVar14;
                  (*pafVar9)[0] = fVar61 + fVar36;
                  (*pafVar9)[1] = fVar64 + fVar37;
                  (*pafVar9)[2] = fVar46 + fVar42;
                  (*pafVar9)[3] = fVar48 + fVar43;
                  pafVar9 = local_c8 + lVar1 + lVar32;
                  (*pafVar9)[0] = fVar67 + fVar38;
                  (*pafVar9)[1] = fVar63 + fVar39;
                  (*pafVar9)[2] = fVar34 + fVar40;
                  (*pafVar9)[3] = fVar35 + fVar41;
                  pfVar2 = (float *)((long)*local_c8 +
                                    ((long)(((ulong)(uint)((int)lVar22 + (int)(lVar7 - lVar8)) <<
                                            0x20) + -0x100000000) >> 0x1c));
                  *pfVar2 = fVar38 - fVar67;
                  pfVar2[1] = fVar39 - fVar63;
                  pfVar2[2] = fVar40 - fVar34;
                  pfVar2[3] = fVar41 - fVar35;
                  fVar67 = (fVar56 - fVar50) * 0.8660254;
                  fVar63 = (fVar57 - fVar52) * 0.8660254;
                  fVar34 = (fVar58 - fVar47) * 0.8660254;
                  fVar35 = (fVar59 - fVar49) * 0.8660254;
                  fVar61 = fVar61 - fVar36 * 0.5;
                  fVar64 = fVar64 - fVar37 * 0.5;
                  fVar46 = fVar46 - fVar42 * 0.5;
                  fVar48 = fVar48 - fVar43 * 0.5;
                  pafVar9 = local_c8 + lVar8 + lVar32;
                  (*pafVar9)[0] = fVar67 + fVar61;
                  (*pafVar9)[1] = fVar63 + fVar64;
                  (*pafVar9)[2] = fVar34 + fVar46;
                  (*pafVar9)[3] = fVar35 + fVar48;
                  pafVar9 = local_c8 + lVar22 + (lVar7 - lVar8);
                  (*pafVar9)[0] = fVar67 - fVar61;
                  (*pafVar9)[1] = fVar63 - fVar64;
                  (*pafVar9)[2] = fVar34 - fVar46;
                  (*pafVar9)[3] = fVar35 - fVar48;
                  lVar8 = lVar8 + 2;
                } while (lVar8 < lVar7);
              }
              local_108 = local_108 + 1;
            } while (local_108 != uVar12);
          }
          break;
        case 4:
          radf4_ps(iVar11,l1,input_readonly,local_c8,wa + iVar19,wa + (iVar19 + iVar11),
                   wa + (iVar11 + iVar19 + iVar11));
          break;
        case 5:
          lVar7 = (long)(int)(~l1 * iVar11 + -1);
          lVar8 = (long)iVar11;
          uVar21 = uVar21 & 0xffffffff;
          if (0 < (int)l1) {
            uVar6 = ~(iVar11 * 6);
            iVar26 = iVar11 * 10;
            iVar29 = iVar11 * 8;
            pafVar25 = local_c8 + lVar8 * 6 + (long)(iVar11 * -6 + -2) + 2;
            pafVar17 = input_readonly + (uVar21 + 1) * lVar8 + 1;
            pafVar9 = input_readonly + ((ulong)(l1 * 3) + 1) * lVar8 + 1;
            pafVar16 = input_readonly + ((ulong)(l1 * 4) + 1) * lVar8 + 1;
            pafVar20 = input_readonly + ((ulong)(l1 * 2) + 1) * lVar8 + 1;
            pafVar13 = input_readonly + ((ulong)(l1 * 5) + 1) * lVar8 + 1;
            uVar24 = uVar21;
            do {
              pafVar30 = pafVar13 + lVar7;
              pafVar31 = pafVar20 + lVar7;
              fVar42 = (*pafVar30)[0] + (*pafVar31)[0];
              fVar43 = (*pafVar30)[1] + (*pafVar31)[1];
              fVar44 = (*pafVar30)[2] + (*pafVar31)[2];
              fVar45 = (*pafVar30)[3] + (*pafVar31)[3];
              fVar34 = (*pafVar30)[0] - (*pafVar31)[0];
              fVar35 = (*pafVar30)[1] - (*pafVar31)[1];
              fVar36 = (*pafVar30)[2] - (*pafVar31)[2];
              fVar37 = (*pafVar30)[3] - (*pafVar31)[3];
              pafVar30 = pafVar16 + lVar7;
              pafVar31 = pafVar9 + lVar7;
              fVar46 = (*pafVar30)[0] + (*pafVar31)[0];
              fVar48 = (*pafVar30)[1] + (*pafVar31)[1];
              fVar50 = (*pafVar30)[2] + (*pafVar31)[2];
              fVar52 = (*pafVar30)[3] + (*pafVar31)[3];
              fVar38 = (*pafVar30)[0] - (*pafVar31)[0];
              fVar39 = (*pafVar30)[1] - (*pafVar31)[1];
              fVar40 = (*pafVar30)[2] - (*pafVar31)[2];
              fVar41 = (*pafVar30)[3] - (*pafVar31)[3];
              pafVar30 = pafVar17 + lVar7;
              fVar61 = (*pafVar30)[0];
              fVar64 = (*pafVar30)[1];
              fVar67 = (*pafVar30)[2];
              fVar63 = (*pafVar30)[3];
              (*pafVar25)[0] = fVar42 + fVar46 + fVar61;
              (*pafVar25)[1] = fVar43 + fVar48 + fVar64;
              (*pafVar25)[2] = fVar44 + fVar50 + fVar67;
              (*pafVar25)[3] = fVar45 + fVar52 + fVar63;
              pafVar30 = local_c8 + (long)(int)uVar6 + (long)iVar29;
              (*pafVar30)[0] = (fVar42 * 0.309017 - fVar46 * 0.809017) + fVar61;
              (*pafVar30)[1] = (fVar43 * 0.309017 - fVar48 * 0.809017) + fVar64;
              (*pafVar30)[2] = (fVar44 * 0.309017 - fVar50 * 0.809017) + fVar67;
              (*pafVar30)[3] = (fVar45 * 0.309017 - fVar52 * 0.809017) + fVar63;
              pafVar30 = local_c8 + (long)(int)uVar6 + (long)iVar29 + 1;
              (*pafVar30)[0] = fVar38 * 0.58778524 + fVar34 * 0.95105654;
              (*pafVar30)[1] = fVar39 * 0.58778524 + fVar35 * 0.95105654;
              (*pafVar30)[2] = fVar40 * 0.58778524 + fVar36 * 0.95105654;
              (*pafVar30)[3] = fVar41 * 0.58778524 + fVar37 * 0.95105654;
              pafVar30 = local_c8 + (long)(int)uVar6 + (long)iVar26;
              (*pafVar30)[0] = (fVar46 * 0.309017 - fVar42 * 0.809017) + fVar61;
              (*pafVar30)[1] = (fVar48 * 0.309017 - fVar43 * 0.809017) + fVar64;
              (*pafVar30)[2] = (fVar50 * 0.309017 - fVar44 * 0.809017) + fVar67;
              (*pafVar30)[3] = (fVar52 * 0.309017 - fVar45 * 0.809017) + fVar63;
              pafVar30 = local_c8 + (long)(int)uVar6 + (long)iVar26 + 1;
              (*pafVar30)[0] = fVar34 * 0.58778524 - fVar38 * 0.95105654;
              (*pafVar30)[1] = fVar35 * 0.58778524 - fVar39 * 0.95105654;
              (*pafVar30)[2] = fVar36 * 0.58778524 - fVar40 * 0.95105654;
              (*pafVar30)[3] = fVar37 * 0.58778524 - fVar41 * 0.95105654;
              iVar26 = iVar26 + iVar11 * 5;
              iVar29 = iVar29 + iVar11 * 5;
              pafVar25 = pafVar25 + lVar8 * 5;
              pafVar17 = pafVar17 + lVar8;
              pafVar9 = pafVar9 + lVar8;
              pafVar16 = pafVar16 + lVar8;
              pafVar20 = pafVar20 + lVar8;
              pafVar13 = pafVar13 + lVar8;
              uVar24 = uVar24 - 1;
            } while (uVar24 != 0);
          }
          if (iVar11 != 1 && 0 < (int)l1) {
            iVar26 = iVar19 + iVar11 + iVar11;
            lVar14 = (long)(iVar11 * -6 + -2);
            pafVar25 = input_readonly + lVar7 + (uVar21 + 1) * lVar8 + 3;
            pafVar9 = input_readonly + lVar7 + ((ulong)(l1 * 5) + 1) * lVar8 + 3;
            pafVar17 = input_readonly + lVar7 + ((ulong)(l1 * 4) + 1) * lVar8 + 3;
            pafVar13 = input_readonly + lVar7 + ((ulong)(l1 * 3) + 1) * lVar8 + 3;
            pafVar31 = input_readonly + lVar7 + ((ulong)(l1 * 2) + 1) * lVar8 + 3;
            lVar10 = (long)iVar5 * 4 + (long)iVar28 * -4;
            pafVar16 = local_c8 + lVar14 + lVar8 * 10 + 4;
            pafVar30 = local_c8 + lVar14 + lVar8 * 8 + 4;
            pafVar20 = local_c8 + lVar14 + lVar8 * 6 + 4;
            lVar7 = (long)(iVar26 + iVar11) * 4;
            lVar22 = (long)iVar26 * 4;
            lVar27 = (long)(iVar19 + iVar11) * 4;
            local_e0 = local_c8 + lVar14 + (long)(iVar11 + 2) + lVar8 * 9 + -2;
            local_e8 = local_c8 + (long)(iVar11 + 2) + lVar14 + lVar8 * 7 + -2;
            uVar21 = 1;
            do {
              if (2 < iVar11) {
                lVar32 = 3;
                lVar14 = 0;
                pafVar15 = local_e8;
                pafVar18 = local_e0;
                do {
                  fVar61 = *(float *)((long)wa + lVar14 + lVar10);
                  fVar64 = *(float *)((long)wa + lVar14 + lVar10 + 4);
                  fVar67 = *(float *)((long)wa + lVar14 + lVar27);
                  fVar63 = *(float *)((long)wa + lVar14 + lVar27 + 4);
                  fVar34 = *(float *)((long)wa + lVar14 + lVar22);
                  fVar35 = *(float *)((long)wa + lVar14 + lVar22 + 4);
                  fVar36 = *(float *)((long)wa + lVar14 + lVar7);
                  fVar37 = *(float *)((long)wa + lVar14 + lVar7 + 4);
                  pfVar3 = pafVar31[-1] + lVar14;
                  pfVar2 = *pafVar31 + lVar14;
                  fVar54 = *pfVar2 * fVar64 + fVar61 * *pfVar3;
                  fVar55 = pfVar2[1] * fVar64 + fVar61 * pfVar3[1];
                  fVar56 = pfVar2[2] * fVar64 + fVar61 * pfVar3[2];
                  fVar57 = pfVar2[3] * fVar64 + fVar61 * pfVar3[3];
                  fVar58 = fVar64 * *pfVar3 - fVar61 * *pfVar2;
                  fVar59 = fVar64 * pfVar3[1] - fVar61 * pfVar2[1];
                  fVar60 = fVar64 * pfVar3[2] - fVar61 * pfVar2[2];
                  fVar61 = fVar64 * pfVar3[3] - fVar61 * pfVar2[3];
                  pfVar3 = pafVar13[-1] + lVar14;
                  pfVar2 = *pafVar13 + lVar14;
                  fVar68 = *pfVar2 * fVar63 + fVar67 * *pfVar3;
                  fVar69 = pfVar2[1] * fVar63 + fVar67 * pfVar3[1];
                  fVar70 = pfVar2[2] * fVar63 + fVar67 * pfVar3[2];
                  fVar72 = pfVar2[3] * fVar63 + fVar67 * pfVar3[3];
                  fVar64 = fVar63 * *pfVar3 - fVar67 * *pfVar2;
                  fVar65 = fVar63 * pfVar3[1] - fVar67 * pfVar2[1];
                  fVar66 = fVar63 * pfVar3[2] - fVar67 * pfVar2[2];
                  fVar67 = fVar63 * pfVar3[3] - fVar67 * pfVar2[3];
                  pfVar3 = pafVar17[-1] + lVar14;
                  pfVar2 = *pafVar17 + lVar14;
                  fVar47 = *pfVar2 * fVar35 + fVar34 * *pfVar3;
                  fVar49 = pfVar2[1] * fVar35 + fVar34 * pfVar3[1];
                  fVar51 = pfVar2[2] * fVar35 + fVar34 * pfVar3[2];
                  fVar53 = pfVar2[3] * fVar35 + fVar34 * pfVar3[3];
                  fVar38 = fVar35 * *pfVar3 - fVar34 * *pfVar2;
                  fVar39 = fVar35 * pfVar3[1] - fVar34 * pfVar2[1];
                  fVar40 = fVar35 * pfVar3[2] - fVar34 * pfVar2[2];
                  fVar41 = fVar35 * pfVar3[3] - fVar34 * pfVar2[3];
                  pfVar3 = pafVar9[-1] + lVar14;
                  pfVar2 = *pafVar9 + lVar14;
                  fVar42 = *pfVar2 * fVar37 + fVar36 * *pfVar3;
                  fVar43 = pfVar2[1] * fVar37 + fVar36 * pfVar3[1];
                  fVar44 = pfVar2[2] * fVar37 + fVar36 * pfVar3[2];
                  fVar45 = pfVar2[3] * fVar37 + fVar36 * pfVar3[3];
                  fVar46 = fVar37 * *pfVar3 - fVar36 * *pfVar2;
                  fVar48 = fVar37 * pfVar3[1] - fVar36 * pfVar2[1];
                  fVar50 = fVar37 * pfVar3[2] - fVar36 * pfVar2[2];
                  fVar52 = fVar37 * pfVar3[3] - fVar36 * pfVar2[3];
                  fVar78 = fVar54 + fVar42;
                  fVar79 = fVar55 + fVar43;
                  fVar80 = fVar56 + fVar44;
                  fVar81 = fVar57 + fVar45;
                  fVar42 = fVar42 - fVar54;
                  fVar43 = fVar43 - fVar55;
                  fVar44 = fVar44 - fVar56;
                  fVar45 = fVar45 - fVar57;
                  fVar54 = fVar58 - fVar46;
                  fVar55 = fVar59 - fVar48;
                  fVar56 = fVar60 - fVar50;
                  fVar57 = fVar61 - fVar52;
                  fVar46 = fVar46 + fVar58;
                  fVar48 = fVar48 + fVar59;
                  fVar50 = fVar50 + fVar60;
                  fVar52 = fVar52 + fVar61;
                  fVar58 = fVar68 + fVar47;
                  fVar59 = fVar69 + fVar49;
                  fVar60 = fVar70 + fVar51;
                  fVar62 = fVar72 + fVar53;
                  fVar47 = fVar47 - fVar68;
                  fVar49 = fVar49 - fVar69;
                  fVar51 = fVar51 - fVar70;
                  fVar53 = fVar53 - fVar72;
                  fVar68 = fVar64 - fVar38;
                  fVar69 = fVar65 - fVar39;
                  fVar70 = fVar66 - fVar40;
                  fVar72 = fVar67 - fVar41;
                  fVar38 = fVar38 + fVar64;
                  fVar39 = fVar39 + fVar65;
                  fVar40 = fVar40 + fVar66;
                  fVar41 = fVar41 + fVar67;
                  pfVar2 = pafVar25[-1] + lVar14;
                  fVar61 = *pfVar2;
                  fVar64 = pfVar2[1];
                  fVar67 = pfVar2[2];
                  fVar63 = pfVar2[3];
                  pfVar2 = pafVar20[-1] + lVar14;
                  *pfVar2 = fVar58 + fVar78 + fVar61;
                  pfVar2[1] = fVar59 + fVar79 + fVar64;
                  pfVar2[2] = fVar60 + fVar80 + fVar67;
                  pfVar2[3] = fVar62 + fVar81 + fVar63;
                  pfVar2 = *pafVar25 + lVar14;
                  fVar34 = *pfVar2;
                  fVar35 = pfVar2[1];
                  fVar36 = pfVar2[2];
                  fVar37 = pfVar2[3];
                  pfVar2 = *pafVar20 + lVar14;
                  *pfVar2 = fVar34 - (fVar38 + fVar46);
                  pfVar2[1] = fVar35 - (fVar39 + fVar48);
                  pfVar2[2] = fVar36 - (fVar40 + fVar50);
                  pfVar2[3] = fVar37 - (fVar41 + fVar52);
                  fVar74 = fVar34 - (fVar46 * 0.309017 - fVar38 * 0.809017);
                  fVar75 = fVar35 - (fVar48 * 0.309017 - fVar39 * 0.809017);
                  fVar76 = fVar36 - (fVar50 * 0.309017 - fVar40 * 0.809017);
                  fVar77 = fVar37 - (fVar52 * 0.309017 - fVar41 * 0.809017);
                  fVar65 = (fVar78 * 0.309017 - fVar58 * 0.809017) + fVar61;
                  fVar66 = (fVar79 * 0.309017 - fVar59 * 0.809017) + fVar64;
                  fVar71 = (fVar80 * 0.309017 - fVar60 * 0.809017) + fVar67;
                  fVar73 = (fVar81 * 0.309017 - fVar62 * 0.809017) + fVar63;
                  fVar61 = (fVar58 * 0.309017 - fVar78 * 0.809017) + fVar61;
                  fVar64 = (fVar59 * 0.309017 - fVar79 * 0.809017) + fVar64;
                  fVar67 = (fVar60 * 0.309017 - fVar80 * 0.809017) + fVar67;
                  fVar63 = (fVar62 * 0.309017 - fVar81 * 0.809017) + fVar63;
                  fVar34 = fVar34 - (fVar38 * 0.309017 - fVar46 * 0.809017);
                  fVar35 = fVar35 - (fVar39 * 0.309017 - fVar48 * 0.809017);
                  fVar36 = fVar36 - (fVar40 * 0.309017 - fVar50 * 0.809017);
                  fVar37 = fVar37 - (fVar41 * 0.309017 - fVar52 * 0.809017);
                  fVar46 = fVar68 * 0.58778524 + fVar54 * 0.95105654;
                  fVar48 = fVar69 * 0.58778524 + fVar55 * 0.95105654;
                  fVar50 = fVar70 * 0.58778524 + fVar56 * 0.95105654;
                  fVar52 = fVar72 * 0.58778524 + fVar57 * 0.95105654;
                  fVar58 = fVar47 * 0.58778524 + fVar42 * 0.95105654;
                  fVar59 = fVar49 * 0.58778524 + fVar43 * 0.95105654;
                  fVar60 = fVar51 * 0.58778524 + fVar44 * 0.95105654;
                  fVar62 = fVar53 * 0.58778524 + fVar45 * 0.95105654;
                  fVar54 = fVar54 * 0.58778524 - fVar68 * 0.95105654;
                  fVar55 = fVar55 * 0.58778524 - fVar69 * 0.95105654;
                  fVar56 = fVar56 * 0.58778524 - fVar70 * 0.95105654;
                  fVar57 = fVar57 * 0.58778524 - fVar72 * 0.95105654;
                  fVar38 = fVar42 * 0.58778524 - fVar47 * 0.95105654;
                  fVar39 = fVar43 * 0.58778524 - fVar49 * 0.95105654;
                  fVar40 = fVar44 * 0.58778524 - fVar51 * 0.95105654;
                  fVar41 = fVar45 * 0.58778524 - fVar53 * 0.95105654;
                  pfVar2 = pafVar30[-1] + lVar14;
                  *pfVar2 = fVar65 - fVar46;
                  pfVar2[1] = fVar66 - fVar48;
                  pfVar2[2] = fVar71 - fVar50;
                  pfVar2[3] = fVar73 - fVar52;
                  pafVar15[-1][0] = fVar46 + fVar65;
                  pafVar15[-1][1] = fVar48 + fVar66;
                  pafVar15[-1][2] = fVar50 + fVar71;
                  pafVar15[-1][3] = fVar52 + fVar73;
                  pfVar2 = *pafVar30 + lVar14;
                  *pfVar2 = fVar58 + fVar74;
                  pfVar2[1] = fVar59 + fVar75;
                  pfVar2[2] = fVar60 + fVar76;
                  pfVar2[3] = fVar62 + fVar77;
                  (*pafVar15)[0] = fVar58 - fVar74;
                  (*pafVar15)[1] = fVar59 - fVar75;
                  (*pafVar15)[2] = fVar60 - fVar76;
                  (*pafVar15)[3] = fVar62 - fVar77;
                  pfVar2 = pafVar16[-1] + lVar14;
                  *pfVar2 = fVar61 - fVar54;
                  pfVar2[1] = fVar64 - fVar55;
                  pfVar2[2] = fVar67 - fVar56;
                  pfVar2[3] = fVar63 - fVar57;
                  pafVar18[-1][0] = fVar54 + fVar61;
                  pafVar18[-1][1] = fVar55 + fVar64;
                  pafVar18[-1][2] = fVar56 + fVar67;
                  pafVar18[-1][3] = fVar57 + fVar63;
                  pfVar2 = *pafVar16 + lVar14;
                  *pfVar2 = fVar38 + fVar34;
                  pfVar2[1] = fVar39 + fVar35;
                  pfVar2[2] = fVar40 + fVar36;
                  pfVar2[3] = fVar41 + fVar37;
                  (*pafVar18)[0] = fVar38 - fVar34;
                  (*pafVar18)[1] = fVar39 - fVar35;
                  (*pafVar18)[2] = fVar40 - fVar36;
                  (*pafVar18)[3] = fVar41 - fVar37;
                  lVar32 = lVar32 + 2;
                  lVar14 = lVar14 + 8;
                  pafVar18 = pafVar18 + -2;
                  pafVar15 = pafVar15 + -2;
                } while (lVar32 <= lVar8);
              }
              uVar21 = uVar21 + 1;
              pafVar16 = pafVar16 + lVar8 * 5;
              pafVar30 = pafVar30 + lVar8 * 5;
              pafVar20 = pafVar20 + lVar8 * 5;
              pafVar25 = pafVar25 + lVar8;
              pafVar9 = pafVar9 + lVar8;
              pafVar17 = pafVar17 + lVar8;
              pafVar13 = pafVar13 + lVar8;
              pafVar31 = pafVar31 + lVar8;
              local_e0 = local_e0 + lVar8 * 5;
              local_e8 = local_e8 + lVar8 * 5;
            } while (uVar21 != l1 + 1);
          }
        }
        bVar33 = local_c8 == work2;
        input_readonly = work1;
        local_c8 = work2;
        if (bVar33) {
          input_readonly = work2;
          local_c8 = work1;
        }
        uVar23 = uVar23 + 1;
        iVar5 = iVar19;
      } while (uVar23 != uVar4 + 1);
    }
    return input_readonly;
  }
  __assert_fail("in != out && work1 != work2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jcj83429[P]ShapingClipper/pffft.c"
                ,0x3c7,
                "v4sf *rfftf1_ps(int, const v4sf *, v4sf *, v4sf *, const float *, const int *)");
}

Assistant:

static NEVER_INLINE(v4sf *) rfftf1_ps(int n, const v4sf *input_readonly, v4sf *work1, v4sf *work2, 
                                      const float *wa, const int *ifac) {  
  v4sf *in  = (v4sf*)input_readonly;
  v4sf *out = (in == work2 ? work1 : work2);
  int nf = ifac[1], k1;
  int l2 = n;
  int iw = n-1;
  assert(in != out && work1 != work2);
  for (k1 = 1; k1 <= nf; ++k1) {
    int kh = nf - k1;
    int ip = ifac[kh + 2];
    int l1 = l2 / ip;
    int ido = n / l2;
    iw -= (ip - 1)*ido;
    switch (ip) {
      case 5: {
        int ix2 = iw + ido;
        int ix3 = ix2 + ido;
        int ix4 = ix3 + ido;
        radf5_ps(ido, l1, in, out, &wa[iw], &wa[ix2], &wa[ix3], &wa[ix4]);
      } break;
      case 4: {
        int ix2 = iw + ido;
        int ix3 = ix2 + ido;
        radf4_ps(ido, l1, in, out, &wa[iw], &wa[ix2], &wa[ix3]);
      } break;
      case 3: {
        int ix2 = iw + ido;
        radf3_ps(ido, l1, in, out, &wa[iw], &wa[ix2]);
      } break;
      case 2:
        radf2_ps(ido, l1, in, out, &wa[iw]);
        break;
      default:
        assert(0);
        break;
    }
    l2 = l1;
    if (out == work2) {
      out = work1; in = work2;
    } else {
      out = work2; in = work1;
    }
  }
  return in; /* this is in fact the output .. */
}